

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransArray.cc
# Opt level: O3

void __thiscall TransArray::~TransArray(TransArray *this)

{
  pointer plVar1;
  pointer piVar2;
  
  piVar2 = (this->theArray).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->theArray).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish != piVar2) {
    (this->theArray).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  plVar1 = (this->offset).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->offset).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_finish != plVar1) {
    (this->offset).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = plVar1;
  }
  if (plVar1 != (pointer)0x0) {
    operator_delete(plVar1);
    piVar2 = (this->theArray).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
    return;
  }
  return;
}

Assistant:

TransArray::~TransArray() {
    theArray.clear();
    offset.clear();
}